

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O3

void __thiscall xray_re::xr_object::load_object(xr_object *this,xr_reader *r)

{
  uint *puVar1;
  pointer ppxVar2;
  xr_surface *pxVar3;
  char *pcVar4;
  float *pfVar5;
  uint32_t *puVar6;
  size_t sVar7;
  char *__s;
  xr_reader *pxVar8;
  uint32_t uVar9;
  pointer ppxVar10;
  ulong uVar11;
  uint16_t version;
  xr_reader *s;
  xr_bone *local_68;
  f_r_new<xray_re::xr_surface> local_60;
  short local_4a;
  xr_reader *local_48;
  xr_bone *local_40;
  pointer local_38;
  
  sVar7 = xr_reader::r_raw_chunk(r,0x900,&local_4a,2);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                  ,0x7c,"virtual void xray_re::xr_object::load_object(xr_reader &)");
  }
  if (local_4a != 0x10) {
    __assert_fail("version == EOBJ_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                  ,0x7d,"virtual void xray_re::xr_object::load_object(xr_reader &)");
  }
  sVar7 = xr_reader::r_raw_chunk(r,0x903,&this->m_flags,4);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                  ,0x80,"virtual void xray_re::xr_object::load_object(xr_reader &)");
  }
  sVar7 = xr_reader::find_chunk(r,0x912);
  if (sVar7 != 0) {
    xr_reader::r_sz(r,&this->m_userdata);
  }
  sVar7 = xr_reader::find_chunk(r,0x925);
  if (sVar7 != 0) {
    xr_reader::r_sz(r,&this->m_lod_ref);
  }
  sVar7 = xr_reader::find_chunk(r,0x907);
  if (sVar7 == 0) {
    sVar7 = xr_reader::find_chunk(r,0x906);
    if (sVar7 == 0) {
      sVar7 = xr_reader::find_chunk(r,0x905);
      if (sVar7 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                      ,0x9d,"virtual void xray_re::xr_object::load_object(xr_reader &)");
      }
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar11 = (ulong)*puVar1;
      local_60.pmf = (offset_in_xr_surface_to_subr)xr_surface::load_0;
      local_60._8_8_ = 0;
      std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::reserve
                (&this->m_surfaces,uVar11);
      if (uVar11 != 0) {
        do {
          local_68 = (xr_bone *)0x0;
          std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>::
          emplace_back<xray_re::xr_surface*>
                    ((vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>> *)
                     &this->m_surfaces,(xr_surface **)&local_68);
          xr_reader::f_r_new<xray_re::xr_surface>::operator()
                    (&local_60,
                     (this->m_surfaces).
                     super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,r);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      sVar7 = xr_reader::find_chunk(r,0x918);
      if (sVar7 != 0) {
        ppxVar10 = (this->m_surfaces).
                   super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppxVar2 = (this->m_surfaces).
                  super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppxVar10 != ppxVar2) {
          do {
            local_38 = ppxVar2;
            __s = xr_reader::skip_sz(r);
            pxVar3 = *ppxVar10;
            pcVar4 = (char *)(pxVar3->m_cshader)._M_string_length;
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&pxVar3->m_cshader,0,pcVar4,(ulong)__s);
            ppxVar10 = ppxVar10 + 1;
            ppxVar2 = local_38;
          } while (ppxVar10 != local_38);
        }
      }
    }
    else {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar11 = (ulong)*puVar1;
      local_60.pmf = (offset_in_xr_surface_to_subr)xr_surface::load_1;
      local_60._8_8_ = 0;
      std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::reserve
                (&this->m_surfaces,uVar11);
      if (uVar11 != 0) {
        do {
          local_68 = (xr_bone *)0x0;
          std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>::
          emplace_back<xray_re::xr_surface*>
                    ((vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>> *)
                     &this->m_surfaces,(xr_surface **)&local_68);
          xr_reader::f_r_new<xray_re::xr_surface>::operator()
                    (&local_60,
                     (this->m_surfaces).
                     super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,r);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
    }
  }
  else {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    uVar11 = (ulong)*puVar1;
    local_60.pmf = (offset_in_xr_surface_to_subr)xr_surface::load_2;
    local_60._8_8_ = 0;
    std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::reserve
              (&this->m_surfaces,uVar11);
    if (uVar11 != 0) {
      do {
        local_68 = (xr_bone *)0x0;
        std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>::
        emplace_back<xray_re::xr_surface*>
                  ((vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>> *)
                   &this->m_surfaces,(xr_surface **)&local_68);
        xr_reader::f_r_new<xray_re::xr_surface>::operator()
                  (&local_60,
                   (this->m_surfaces).
                   super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,r);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  pxVar8 = xr_reader::open_chunk(r,0x910);
  local_48 = pxVar8;
  if (pxVar8 != (xr_reader *)0x0) {
    local_60.pmf = (offset_in_xr_surface_to_subr)this;
    local_68 = (xr_bone *)xr_reader::open_chunk(pxVar8,0);
    if (local_68 != (xr_bone *)0x0) {
      uVar9 = 1;
      do {
        local_40 = (xr_bone *)0x0;
        std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>::
        emplace_back<xray_re::xr_mesh*>
                  ((vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>> *)&this->m_meshes,
                   (xr_mesh **)&local_40);
        read_mesh::operator()
                  ((read_mesh *)&local_60,
                   (this->m_meshes).
                   super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1,(xr_reader *)local_68);
        xr_reader::close_chunk(pxVar8,(xr_reader **)&local_68);
        local_68 = (xr_bone *)xr_reader::open_chunk(pxVar8,uVar9);
        uVar9 = uVar9 + 1;
      } while (local_68 != (xr_bone *)0x0);
    }
    xr_reader::close_chunk(r,&local_48);
  }
  pxVar8 = xr_reader::open_chunk(r,0x921);
  local_48 = pxVar8;
  if (pxVar8 == (xr_reader *)0x0) {
    sVar7 = xr_reader::find_chunk(r,0x913);
    pxVar8 = local_48;
    if (sVar7 != 0) {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar11 = (ulong)*puVar1;
      local_60.pmf = (offset_in_xr_surface_to_subr)xr_bone::load_0;
      local_60._8_8_ = 0;
      std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::reserve
                (&this->m_bones,uVar11);
      if (uVar11 != 0) {
        do {
          local_68 = (xr_bone *)0x0;
          std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>::
          emplace_back<xray_re::xr_bone*>
                    ((vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>> *)&this->m_bones,
                     &local_68);
          xr_reader::f_r_new<xray_re::xr_bone>::operator()
                    ((f_r_new<xray_re::xr_bone> *)&local_60,
                     (this->m_bones).
                     super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1,pxVar8);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
    }
  }
  else {
    local_60.pmf = (offset_in_xr_surface_to_subr)xr_bone::load_1;
    local_60._8_8_ = 0;
    local_68 = (xr_bone *)xr_reader::open_chunk(pxVar8,0);
    if (local_68 != (xr_bone *)0x0) {
      uVar9 = 1;
      do {
        local_40 = (xr_bone *)0x0;
        std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>::
        emplace_back<xray_re::xr_bone*>
                  ((vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>> *)&this->m_bones,
                   &local_40);
        xr_reader::f_r_new<xray_re::xr_bone>::operator()
                  ((f_r_new<xray_re::xr_bone> *)&local_60,
                   (this->m_bones).
                   super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1,(xr_reader *)local_68);
        xr_reader::close_chunk(pxVar8,(xr_reader **)&local_68);
        local_68 = (xr_bone *)xr_reader::open_chunk(pxVar8,uVar9);
        uVar9 = uVar9 + 1;
      } while (local_68 != (xr_bone *)0x0);
    }
    xr_reader::close_chunk(r,&local_48);
  }
  setup_bones(this);
  sVar7 = xr_reader::find_chunk(r,0x916);
  if (sVar7 != 0) {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    uVar11 = (ulong)*puVar1;
    local_60.pmf = 0x11;
    local_60._8_8_ = 0;
    std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::reserve
              (&this->m_motions,uVar11);
    if (uVar11 != 0) {
      do {
        local_68 = (xr_bone *)0x0;
        std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>::
        emplace_back<xray_re::xr_skl_motion*>
                  ((vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>> *)
                   &this->m_motions,(xr_skl_motion **)&local_68);
        xr_reader::f_r_new<xray_re::xr_skl_motion>::operator()
                  ((f_r_new<xray_re::xr_skl_motion> *)&local_60,
                   (this->m_motions).
                   super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,r);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  sVar7 = xr_reader::find_chunk(r,0x924);
  if (sVar7 != 0) {
    xr_reader::r_sz(r,&this->m_motion_refs);
  }
  sVar7 = xr_reader::find_chunk(r,0x919);
  if (sVar7 == 0) {
    sVar7 = xr_reader::find_chunk(r,0x923);
    if (sVar7 != 0) {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar11 = (ulong)*puVar1;
      local_60.pmf = (offset_in_xr_surface_to_subr)xr_partition::load_1;
      local_60._8_8_ = 0;
      std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::reserve
                (&this->m_partitions,uVar11);
      if (uVar11 != 0) {
        do {
          local_68 = (xr_bone *)0x0;
          std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>::
          emplace_back<xray_re::xr_partition*>
                    ((vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>> *)
                     &this->m_partitions,(xr_partition **)&local_68);
          xr_reader::f_r_new<xray_re::xr_partition>::operator()
                    ((f_r_new<xray_re::xr_partition> *)&local_60,
                     (this->m_partitions).
                     super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,r);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
    }
  }
  else {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    uVar11 = (ulong)*puVar1;
    local_60.pmf = (offset_in_xr_surface_to_subr)&this->m_bones;
    std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::reserve
              (&this->m_partitions,uVar11);
    if (uVar11 != 0) {
      do {
        local_68 = (xr_bone *)0x0;
        std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>::
        emplace_back<xray_re::xr_partition*>
                  ((vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>> *)
                   &this->m_partitions,(xr_partition **)&local_68);
        read_partition_0::operator()
                  ((read_partition_0 *)&local_60,
                   (this->m_partitions).
                   super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,r);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  sVar7 = xr_reader::find_chunk(r,0x920);
  if (sVar7 != 0) {
    pfVar5 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (this->m_position).field_0.field_0.x = *pfVar5;
    pfVar5 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (this->m_position).field_0.field_0.y = *pfVar5;
    pfVar5 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (this->m_position).field_0.field_0.z = *pfVar5;
    pfVar5 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (this->m_rotation).field_0.field_0.x = *pfVar5;
    pfVar5 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (this->m_rotation).field_0.field_0.y = *pfVar5;
    pfVar5 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (this->m_rotation).field_0.field_0.z = *pfVar5;
  }
  sVar7 = xr_reader::find_chunk(r,0x922);
  if (sVar7 != 0) {
    xr_reader::r_sz(r,&this->m_owner_name);
    puVar6 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar6 + 1);
    this->m_creation_time = *puVar6;
    xr_reader::r_sz(r,&this->m_modif_name);
    puVar6 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar6 + 1);
    this->m_modified_time = *puVar6;
  }
  return;
}

Assistant:

void xr_object::load_object(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(EOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == EOBJ_VERSION);

	if (!r.r_chunk<uint32_t>(EOBJ_CHUNK_FLAGS, m_flags))
		xr_not_expected();

	if (r.find_chunk(EOBJ_CHUNK_USERDATA)) {
		r.r_sz(m_userdata);
		r.debug_find_chunk();
	}

	if (r.find_chunk(EOBJ_CHUNK_LOD_REF)) {
		r.r_sz(m_lod_ref);
		r.debug_find_chunk();
	}

	if (r.find_chunk(EOBJ_CHUNK_SURFACES_2)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_2));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_SURFACES_1)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_1));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_SURFACES_0)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_0));
		r.debug_find_chunk();
		if (r.find_chunk(EOBJ_CHUNK_SHADERS_0)) {
			for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end();
					it != end; ++it) {
				(*it)->cshader() = r.skip_sz();
			}
			r.debug_find_chunk();
		}
	} else {
		xr_not_expected();
	}

	xr_reader* s = r.open_chunk(EOBJ_CHUNK_MESHES);
	if (s) {
		s->r_chunks(m_meshes, read_mesh(*this));
		r.close_chunk(s);
	}

	s = r.open_chunk(EOBJ_CHUNK_BONES_1);
	if (s) {
		s->r_chunks(m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_1));
		r.close_chunk(s);
	} else if (r.find_chunk(EOBJ_CHUNK_BONES_0)) {
		s->r_seq(r.r_u32(), m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_0));
		r.debug_find_chunk();
	}
	setup_bones();
	if (r.find_chunk(EOBJ_CHUNK_MOTIONS)) {
		r.r_seq(r.r_u32(), m_motions, xr_reader::f_r_new<xr_skl_motion>(&xr_skl_motion::load));
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_MOTION_REFS)) {
		r.r_sz(m_motion_refs);
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_0)) {
		r.r_seq(r.r_u32(), m_partitions, read_partition_0(m_bones));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_1)) {
		r.r_seq(r.r_u32(), m_partitions, xr_reader::f_r_new<xr_partition>(&xr_partition::load_1));
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_TRANSFORM)) {
		r.r_fvector3(m_position);
		r.r_fvector3(m_rotation);
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_REVISION)) {
		r.r_sz(m_owner_name);
		m_creation_time = r.r_u32();
		r.r_sz(m_modif_name);
		m_modified_time = r.r_u32();
		r.debug_find_chunk();
	}
}